

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O2

ClauseIterator __thiscall Inferences::CompositeISE::simplifyMany(CompositeISE *this,Clause *cl)

{
  char cVar1;
  long in_RDX;
  SplitSet *pSVar2;
  
  if (in_RDX != 0) {
    pSVar2 = (cl->super_Unit)._inference._splits;
    while (pSVar2 != (SplitSet *)0x0) {
      (**(code **)(*(long *)pSVar2->_size + 0x28))(this);
      cVar1 = (**(code **)(*(this->super_ImmediateSimplificationEngine).super_InferenceEngine.
                            _vptr_InferenceEngine + 0x10))();
      if (cVar1 != '\0') {
        return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
      }
      pSVar2 = *(SplitSet **)pSVar2->_items;
      Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                ((VirtualIterator<Kernel::Clause_*> *)this);
    }
  }
  Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator CompositeISE::simplifyMany(Clause* cl)
{
  ISList* curr=_innersMany;
  while(curr && cl) {
    ClauseIterator cIt=curr->head()->simplifyMany(cl);
    if(cIt.hasNext()){
      return cIt;
    } else {
      curr=curr->tail();      
    }
  }
  return ClauseIterator::getEmpty();
}